

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::StreamingReporterBase::testRunEnded(StreamingReporterBase *this,TestRunStats *param_1)

{
  Ptr<Catch::ThreadedSectionInfo>::reset(&this->currentSectionInfo);
  Option<Catch::TestCaseInfo>::reset(&this->unusedTestCaseInfo);
  Option<Catch::GroupInfo>::reset(&this->unusedGroupInfo);
  Option<Catch::TestRunInfo>::reset(&this->testRunInfo);
  return;
}

Assistant:

virtual void testRunEnded( TestRunStats const& /* _testRunStats */ ) {
            currentSectionInfo.reset();
            unusedTestCaseInfo.reset();
            unusedGroupInfo.reset();
            testRunInfo.reset();
        }